

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.cc
# Opt level: O2

state_status_t __thiscall
tchecker::zg::standard_semantics_t::next
          (standard_semantics_t *this,db_t *dbm,clock_id_t dim,bool src_delay_allowed,
          clock_constraint_container_t *src_invariant,clock_constraint_container_t *guard,
          clock_reset_container_t *clkreset,bool tgt_delay_allowed,
          clock_constraint_container_t *tgt_invariant)

{
  status_t sVar1;
  state_status_t sVar2;
  
  sVar1 = tchecker::dbm::constrain(dbm,dim,src_invariant);
  sVar2 = 0x80;
  if (sVar1 != EMPTY) {
    if (src_delay_allowed) {
      tchecker::dbm::open_up(dbm,dim);
      sVar1 = tchecker::dbm::constrain(dbm,dim,src_invariant);
      if (sVar1 == EMPTY) {
        return 0x80;
      }
    }
    sVar1 = tchecker::dbm::constrain(dbm,dim,guard);
    if (sVar1 == EMPTY) {
      sVar2 = 0x40;
    }
    else {
      tchecker::dbm::reset(dbm,dim,clkreset);
      sVar1 = tchecker::dbm::constrain(dbm,dim,tgt_invariant);
      sVar2 = 1;
      if (sVar1 == EMPTY) {
        sVar2 = 0x100;
      }
    }
  }
  return sVar2;
}

Assistant:

tchecker::state_status_t standard_semantics_t::next(tchecker::dbm::db_t * dbm, tchecker::clock_id_t dim, bool src_delay_allowed,
                                                    tchecker::clock_constraint_container_t const & src_invariant,
                                                    tchecker::clock_constraint_container_t const & guard,
                                                    tchecker::clock_reset_container_t const & clkreset, bool tgt_delay_allowed,
                                                    tchecker::clock_constraint_container_t const & tgt_invariant)
{
  if (tchecker::dbm::constrain(dbm, dim, src_invariant) == tchecker::dbm::EMPTY)
    return tchecker::STATE_CLOCKS_SRC_INVARIANT_VIOLATED;

  if (src_delay_allowed) {
    tchecker::dbm::open_up(dbm, dim);

    if (tchecker::dbm::constrain(dbm, dim, src_invariant) == tchecker::dbm::EMPTY)
      return tchecker::STATE_CLOCKS_SRC_INVARIANT_VIOLATED; // should never occur
  }

  if (tchecker::dbm::constrain(dbm, dim, guard) == tchecker::dbm::EMPTY)
    return tchecker::STATE_CLOCKS_GUARD_VIOLATED;

  tchecker::dbm::reset(dbm, dim, clkreset);

  if (tchecker::dbm::constrain(dbm, dim, tgt_invariant) == tchecker::dbm::EMPTY)
    return tchecker::STATE_CLOCKS_TGT_INVARIANT_VIOLATED;

  return tchecker::STATE_OK;
}